

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O0

string * __thiscall
flatbuffers::swift::SwiftGenerator::GenerateVerifierType_abi_cxx11_
          (string *__return_storage_ptr__,SwiftGenerator *this,FieldDef *field)

{
  bool bVar1;
  bool local_119;
  string local_118;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_68 [8];
  Type vector_type;
  undefined1 auStack_40 [7];
  bool is_vector;
  Type type;
  FieldDef *field_local;
  SwiftGenerator *this_local;
  
  auStack_40._0_4_ = (field->value).type.base_type;
  unique0x00012004 = (field->value).type.element;
  type._0_8_ = (field->value).type.struct_def;
  type.struct_def = (StructDef *)(field->value).type.enum_def;
  type.enum_def = *(EnumDef **)&(field->value).type.fixed_length;
  type._24_8_ = field;
  bVar1 = IsVector((Type *)auStack_40);
  local_119 = true;
  if (!bVar1) {
    local_119 = IsArray((Type *)auStack_40);
  }
  vector_type._31_1_ = local_119;
  if (local_119 == false) {
    GenerateNestedVerifierTypes_abi_cxx11_(__return_storage_ptr__,this,(Type *)(type._24_8_ + 200));
  }
  else {
    Type::VectorType((Type *)local_68,(Type *)(type._24_8_ + 200));
    GenerateNestedVerifierTypes_abi_cxx11_(&local_e8,this,(Type *)local_68);
    std::operator+(&local_c8,"ForwardOffset<Vector<",&local_e8);
    std::operator+(&local_a8,&local_c8,", ");
    GenType_abi_cxx11_(&local_118,this,(Type *)local_68,false);
    std::operator+(&local_88,&local_a8,&local_118);
    std::operator+(__return_storage_ptr__,&local_88,">>");
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenerateVerifierType(const FieldDef &field) {
    const auto type = field.value.type;
    const auto is_vector = IsVector(type) || IsArray(type);

    if (is_vector) {
      const auto vector_type = field.value.type.VectorType();
      return "ForwardOffset<Vector<" +
             GenerateNestedVerifierTypes(vector_type) + ", " +
             GenType(vector_type) + ">>";
    }

    return GenerateNestedVerifierTypes(field.value.type);
  }